

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q5_K_ref(float *x,block_q5_K *y,int64_t k)

{
  byte bVar1;
  byte bVar2;
  ggml_fp16_t gVar3;
  uint uVar4;
  long lVar5;
  void *__s;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar6;
  int l2;
  int l1;
  int j_3;
  int n;
  uint8_t m2;
  uint8_t m1;
  uint8_t *ql;
  uint8_t *qh;
  int l_2;
  int ii;
  float dm;
  float d;
  int j_2;
  uint8_t m;
  uint8_t sc;
  uint8_t lm;
  uint8_t ls;
  int j_1;
  float inv_min;
  float inv_scale;
  float min;
  float scale;
  int l_1;
  float av_x;
  int l;
  float sum_x2;
  int j;
  float max_min;
  float max_scale;
  int i;
  uint8_t Laux [32];
  float weights [32];
  float scales [8];
  float mins [8];
  uint8_t L [256];
  int64_t nb;
  int local_298;
  byte local_294;
  int local_290;
  float in_stack_fffffffffffffd74;
  uint local_288;
  float local_284;
  float local_280;
  int local_274;
  int local_270;
  byte local_26a;
  byte local_269;
  long local_268;
  int local_250;
  int local_244;
  byte local_240;
  byte local_23f;
  undefined1 local_23e;
  byte local_23d;
  int local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  int local_228;
  float fVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  float *in_stack_fffffffffffffdf8;
  float *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  int in_stack_fffffffffffffe10;
  float local_1e8 [2];
  uint8_t *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  float afStack_168 [8];
  float local_148 [8];
  byte local_128 [264];
  long local_20;
  long local_10;
  long local_8;
  
  local_20 = in_RDX / 0x100;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (iVar10 = 0; iVar10 < local_20; iVar10 = iVar10 + 1) {
    local_280 = 0.0;
    local_284 = 0.0;
    for (iVar9 = 0; iVar9 < 8; iVar9 = iVar9 + 1) {
      fVar8 = 0.0;
      for (fVar7 = 0.0; (int)fVar7 < 0x20; fVar7 = (float)((int)fVar7 + 1)) {
        fVar8 = *(float *)(local_8 + (long)(iVar9 * 0x20 + (int)fVar7) * 4) *
                *(float *)(local_8 + (long)(iVar9 * 0x20 + (int)fVar7) * 4) + fVar8;
      }
      fVar6 = sqrtf(fVar8 / 32.0);
      for (local_228 = 0; local_228 < 0x20; local_228 = local_228 + 1) {
        local_1e8[local_228] =
             fVar6 + ABS(*(float *)(local_8 + (long)(iVar9 * 0x20 + local_228) * 4));
      }
      fVar7 = make_qkx2_quants(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                               in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                               (uint8_t *)CONCAT44(iVar10,local_280),
                               (float *)CONCAT44(local_284,iVar9),in_stack_fffffffffffffe20,fVar8,
                               fVar7,in_stack_fffffffffffffe28,SUB41((uint)fVar6 >> 0x18,0));
      afStack_168[iVar9] = fVar7;
      local_22c = afStack_168[iVar9];
      if (local_280 < local_22c) {
        local_280 = local_22c;
      }
      local_230 = local_148[iVar9];
      if (local_284 < local_230) {
        local_284 = local_230;
      }
    }
    if (local_280 <= 0.0) {
      local_280 = 0.0;
    }
    else {
      local_280 = 63.0 / local_280;
    }
    local_234 = local_280;
    if (local_284 <= 0.0) {
      local_284 = 0.0;
    }
    else {
      local_284 = 63.0 / local_284;
    }
    local_238 = local_284;
    for (local_23c = 0; local_23c < 8; local_23c = local_23c + 1) {
      iVar9 = nearest_int(local_234 * afStack_168[local_23c]);
      local_23d = (byte)iVar9;
      uVar4 = nearest_int(local_238 * local_148[local_23c]);
      if (local_23d < 0x40) {
        local_288 = (uint)local_23d;
      }
      else {
        local_288 = 0x3f;
      }
      local_23d = (byte)local_288;
      if ((byte)uVar4 < 0x40) {
        in_stack_fffffffffffffd74 = (float)(uVar4 & 0xff);
      }
      else {
        in_stack_fffffffffffffd74 = 8.82818e-44;
      }
      local_23e = SUB41(in_stack_fffffffffffffd74,0);
      if (local_23c < 4) {
        *(byte *)(local_10 + (long)iVar10 * 0xb0 + 4 + (long)local_23c) = local_23d;
        *(undefined1 *)(local_10 + (long)iVar10 * 0xb0 + 4 + (long)(local_23c + 4)) = local_23e;
      }
      else {
        *(byte *)(local_10 + (long)iVar10 * 0xb0 + 4 + (long)(local_23c + 4)) =
             local_23d & 0xf | (byte)(((uint)in_stack_fffffffffffffd74 & 0xf) << 4);
        lVar5 = local_10 + (long)iVar10 * 0xb0;
        *(byte *)(lVar5 + 4 + (long)(local_23c + -4)) =
             *(byte *)(lVar5 + 4 + (long)(local_23c + -4)) | (byte)(((int)local_288 >> 4) << 6);
        lVar5 = local_10 + (long)iVar10 * 0xb0;
        *(byte *)(lVar5 + 4 + (long)local_23c) =
             *(byte *)(lVar5 + 4 + (long)local_23c) |
             (byte)(((int)in_stack_fffffffffffffd74 >> 4) << 6);
      }
    }
    gVar3 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffd74);
    *(ggml_fp16_t *)(local_10 + (long)iVar10 * 0xb0) = gVar3;
    gVar3 = ggml_compute_fp32_to_fp16(in_stack_fffffffffffffd74);
    *(ggml_fp16_t *)(local_10 + (long)iVar10 * 0xb0 + 2) = gVar3;
    for (local_244 = 0; local_244 < 8; local_244 = local_244 + 1) {
      get_scale_min_k4(local_244,(uint8_t *)(local_10 + (long)iVar10 * 0xb0 + 4),&local_23f,
                       &local_240);
      fVar7 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)iVar10 * 0xb0));
      fVar7 = fVar7 * (float)local_23f;
      if ((fVar7 != 0.0) || (NAN(fVar7))) {
        fVar8 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_10 + (long)iVar10 * 0xb0 + 2));
        uVar4 = (uint)local_240;
        for (local_250 = 0; local_250 < 0x20; local_250 = local_250 + 1) {
          local_298 = nearest_int((*(float *)(local_8 + (long)(local_244 * 0x20 + local_250) * 4) +
                                  fVar8 * (float)uVar4) / fVar7);
          local_290 = local_298;
          if (0x1f < local_298) {
            local_290 = 0x1f;
          }
          if (local_290 < 0) {
            local_294 = 0;
          }
          else {
            if (0x1f < local_298) {
              local_298 = 0x1f;
            }
            local_294 = (byte)local_298;
          }
          local_128[local_244 * 0x20 + local_250] = local_294;
        }
      }
    }
    __s = (void *)(local_10 + (long)iVar10 * 0xb0 + 0x10);
    local_268 = local_10 + (long)iVar10 * 0xb0 + 0x30;
    memset(__s,0,0x20);
    local_269 = 1;
    local_26a = 2;
    for (local_270 = 0; local_270 < 0x100; local_270 = local_270 + 0x40) {
      for (local_274 = 0; local_274 < 0x20; local_274 = local_274 + 1) {
        bVar1 = local_128[local_270 + local_274];
        if (0xf < bVar1) {
          bVar1 = bVar1 - 0x10;
          *(byte *)((long)__s + (long)local_274) =
               *(byte *)((long)__s + (long)local_274) | local_269;
        }
        bVar2 = local_128[local_270 + local_274 + 0x20];
        if (0xf < bVar2) {
          bVar2 = bVar2 - 0x10;
          *(byte *)((long)__s + (long)local_274) =
               *(byte *)((long)__s + (long)local_274) | local_26a;
        }
        *(byte *)(local_268 + local_274) = bVar1 | bVar2 << 4;
      }
      local_269 = local_269 << 2;
      local_26a = local_26a << 2;
      local_268 = local_268 + 0x20;
    }
    local_8 = local_8 + 0x400;
  }
  return;
}

Assistant:

void quantize_row_q5_K_ref(const float * GGML_RESTRICT x, block_q5_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    uint8_t L[QK_K];
    float mins[QK_K/32];
    float scales[QK_K/32];
    float weights[32];
    uint8_t Laux[32];

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/32; ++j) {
            //scales[j] = make_qkx1_quants(32, 31, x + 32*j, L + 32*j, &mins[j], 9, 0.5f);
            float sum_x2 = 0;
            for (int l = 0; l < 32; ++l) sum_x2 += x[32*j + l] * x[32*j + l];
            float av_x = sqrtf(sum_x2/32);
            for (int l = 0; l < 32; ++l) weights[l] = av_x + fabsf(x[32*j + l]);
            scales[j] = make_qkx2_quants(32, 31, x + 32*j, weights, L + 32*j, &mins[j], Laux, -0.5f, 0.1f, 15, false);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        float inv_scale = max_scale > 0 ? 63.f/max_scale : 0.f;
        float inv_min   = max_min   > 0 ? 63.f/max_min   : 0.f;
        for (int j = 0; j < QK_K/32; ++j) {
            uint8_t ls = nearest_int(inv_scale*scales[j]);
            uint8_t lm = nearest_int(inv_min*mins[j]);
            ls = MIN(63, ls);
            lm = MIN(63, lm);
            if (j < 4) {
                y[i].scales[j] = ls;
                y[i].scales[j+4] = lm;
            } else {
                y[i].scales[j+4] = (ls & 0xF) | ((lm & 0xF) << 4);
                y[i].scales[j-4] |= ((ls >> 4) << 6);
                y[i].scales[j-0] |= ((lm >> 4) << 6);
            }
        }
        y[i].d = GGML_FP32_TO_FP16(max_scale/63.f);
        y[i].dmin = GGML_FP32_TO_FP16(max_min/63.f);

        uint8_t sc, m;
        for (int j = 0; j < QK_K/32; ++j) {
            get_scale_min_k4(j, y[i].scales, &sc, &m);
            const float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * m;
            for (int ii = 0; ii < 32; ++ii) {
                int l = nearest_int((x[32*j + ii] + dm)/d);
                l = MAX(0, MIN(31, l));
                L[32*j + ii] = l;
            }
        }

        uint8_t * GGML_RESTRICT qh = y[i].qh;
        uint8_t * GGML_RESTRICT ql = y[i].qs;
        memset(qh, 0, QK_K/8);

        uint8_t m1 = 1, m2 = 2;
        for (int n = 0; n < QK_K; n += 64) {
            for (int j = 0; j < 32; ++j) {
                int l1 = L[n + j];
                if (l1 > 15) {
                    l1 -= 16; qh[j] |= m1;
                }
                int l2 = L[n + j + 32];
                if (l2 > 15) {
                    l2 -= 16; qh[j] |= m2;
                }
                ql[j] = l1 | (l2 << 4);
            }
            m1 <<= 2; m2 <<= 2;
            ql += 32;
        }

        x += QK_K;
    }
}